

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall duckdb_re2::Compiler::EmptyWidth(Compiler *this,EmptyOp empty)

{
  uint32_t begin;
  PatchList end;
  Inst *in_RDI;
  Frag FVar1;
  int unaff_retaddr;
  Compiler *in_stack_00000008;
  int id;
  uint32_t in_stack_ffffffffffffffb8;
  EmptyOp in_stack_ffffffffffffffbc;
  Frag local_30 [2];
  Frag local_10;
  
  begin = AllocInst(in_stack_00000008,unaff_retaddr);
  if ((int)begin < 0) {
    FVar1 = NoMatch((Compiler *)0x814f56);
    local_30[0]._0_8_ = FVar1._0_8_;
    local_10.begin = local_30[0].begin;
    local_10.end.head = local_30[0].end.head;
    local_30[0].end.tail = FVar1.end.tail;
    local_10.end.tail = local_30[0].end.tail;
    local_30[0].nullable = FVar1.nullable;
    local_10.nullable = local_30[0].nullable;
  }
  else {
    PODArray<duckdb_re2::Prog::Inst>::operator[]
              ((PODArray<duckdb_re2::Prog::Inst> *)in_RDI,in_stack_ffffffffffffffbc);
    Prog::Inst::InitEmptyWidth(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    end = PatchList::Mk(begin << 1);
    Frag::Frag(&local_10,begin,end,true);
  }
  FVar1.end.tail = local_10.end.tail;
  FVar1.begin = local_10.begin;
  FVar1.end.head = local_10.end.head;
  FVar1.nullable = local_10.nullable;
  FVar1._13_3_ = local_10._13_3_;
  return FVar1;
}

Assistant:

Frag Compiler::EmptyWidth(EmptyOp empty) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitEmptyWidth(empty, 0);
  return Frag(id, PatchList::Mk(id << 1), true);
}